

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

PackedStructFieldDef * __thiscall
kratos::VarPackedStruct::get_definition(VarPackedStruct *this,string *name)

{
  element_type *peVar1;
  PackedStructFieldDef *pPVar2;
  __type _Var3;
  PackedStructFieldDef *def;
  PackedStructFieldDef *__rhs;
  
  peVar1 = (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  __rhs = (peVar1->attributes).
          super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (peVar1->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__rhs == pPVar2) {
      return (PackedStructFieldDef *)0x0;
    }
    _Var3 = std::operator==(name,&__rhs->name);
    if (_Var3) break;
    __rhs = __rhs + 1;
  }
  return __rhs;
}

Assistant:

const PackedStructFieldDef *VarPackedStruct::get_definition(const std::string &name) const {
    for (auto const &def : struct_->attributes) {
        if (name == def.name) {
            return &def;
        }
    }
    return nullptr;
}